

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  cmSourceGroup *pcVar2;
  cmSourceGroup *pcVar3;
  cmSourceGroup *this_00;
  cmSourceGroup *unaff_R15;
  bool bVar4;
  
  pcVar1 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
           .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
  this_00 = *(cmSourceGroup **)
             &(pcVar1->GroupChildren).
              super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
  pcVar2 = *(pointer *)
            ((long)&(pcVar1->GroupChildren).
                    super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
  bVar4 = this_00 == pcVar2;
  if (!bVar4) {
    pcVar3 = MatchChildrenRegex(this_00,name);
    unaff_R15 = pcVar3;
    while (unaff_R15 == (cmSourceGroup *)0x0) {
      this_00 = this_00 + 1;
      bVar4 = this_00 == pcVar2;
      unaff_R15 = pcVar3;
      if (bVar4) break;
      unaff_R15 = MatchChildrenRegex(this_00,name);
    }
  }
  if (bVar4) {
    bVar4 = cmsys::RegularExpression::find
                      (&this->GroupRegex,(name->_M_dataplus)._M_p,&(this->GroupRegex).regmatch);
    unaff_R15 = (cmSourceGroup *)0x0;
    if (bVar4) {
      unaff_R15 = this;
    }
  }
  return unaff_R15;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenRegex(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenRegex(name);
    if (result) {
      return result;
    }
  }
  if (this->MatchesRegex(name)) {
    return this;
  }

  return nullptr;
}